

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  size_t __n;
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  
  __n = s->_M_string_length;
  if ((long)__n < 0x80) {
    lVar1 = *(long *)this;
    uVar4 = num * 8;
    iVar3 = TagSize(uVar4);
    if ((long)__n <= (long)(~(ulong)(ptr + iVar3) + lVar1 + 0x10)) {
      if (uVar4 < 0x80) {
        *ptr = (byte)uVar4 | 2;
        puVar6 = ptr + 1;
      }
      else {
        *ptr = (byte)uVar4 | 0x82;
        if (uVar4 < 0x4000) {
          ptr[1] = (uint8)(uVar4 >> 7);
          puVar6 = ptr + 2;
        }
        else {
          puVar6 = ptr + 2;
          uVar4 = uVar4 >> 7;
          do {
            puVar7 = puVar6;
            puVar7[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            puVar6 = puVar7 + 1;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar2);
          *puVar7 = (uint8)uVar5;
        }
      }
      *puVar6 = (uint8)__n;
      memcpy(puVar6 + 1,(s->_M_dataplus)._M_p,__n);
      return puVar6 + __n + 1;
    }
  }
  puVar6 = (uint8 *)google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
                              ((uint)this,(string *)(ulong)num,(uchar *)s);
  return puVar6;
}

Assistant:

uint8* WriteStringMaybeAliased(uint32 num, const std::string& s, uint8* ptr) {
    std::ptrdiff_t size = s.size();
    if (PROTOBUF_PREDICT_FALSE(
            size >= 128 || end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }